

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mersennetwister.h
# Opt level: O2

uint32 __thiscall MTRand::randInt(MTRand *this,uint32 *n)

{
  uint32 uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = *n >> 1 | *n;
  uVar3 = uVar3 >> 2 | uVar3;
  uVar3 = uVar3 >> 4 | uVar3;
  uVar3 = uVar3 >> 8 | uVar3;
  do {
    uVar1 = randInt(this);
    uVar2 = uVar1 & (uVar3 >> 0x10 | uVar3);
  } while (*n < uVar2);
  return uVar2;
}

Assistant:

MTRand::uint32 MTRand::randInt(const uint32 &n) {
  // Find which bits are used in n
  // Optimized by Magnus Jonsson (magnus@smartelectronix.com)
  uint32 used = n;
  used |= used >> 1;
  used |= used >> 2;
  used |= used >> 4;
  used |= used >> 8;
  used |= used >> 16;

  // Draw numbers until one is found in [0,n]
  uint32 i;
  do
    i = randInt() & used; // toss unused bits to shorten search
  while (i > n);
  return i;
}